

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_cepview.c
# Opt level: O0

int read_cep(char *file,float ***cep,int *numframes,int cepsize)

{
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  float **ppfVar6;
  float32 **mfcbuf;
  int byterev;
  int n;
  int i;
  stat statbuf;
  int n_float;
  FILE *fp;
  int cepsize_local;
  int *numframes_local;
  float ***cep_local;
  char *file_local;
  
  iVar2 = stat_retry(file,(stat *)&n);
  if (iVar2 < 0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                   ,0xc6,"Failed to get file size \'%s\'",file);
    file_local._4_4_ = -1;
  }
  else {
    __stream = fopen(file,"rb");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                     ,0xcb,"Failed to open \'%s\' for reading",file);
      file_local._4_4_ = -1;
    }
    else {
      sVar5 = fread((void *)((long)statbuf.__glibc_reserved + 0x14),4,1,__stream);
      if (sVar5 == 1) {
        bVar1 = false;
        if ((long)(int)(statbuf.__glibc_reserved[2]._4_4_ * 4 + 4) != statbuf.st_rdev) {
          uVar3 = (int)statbuf.__glibc_reserved[2]._4_4_ >> 0x18 & 0xffU |
                  (int)statbuf.__glibc_reserved[2]._4_4_ >> 8 & 0xff00U |
                  (statbuf.__glibc_reserved[2]._4_4_ & 0xff00) << 8 |
                  statbuf.__glibc_reserved[2]._4_4_ << 0x18;
          if ((long)(int)(uVar3 * 4 + 4) != statbuf.st_rdev) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                    ,0xde,"Header size field: %d(%08x); filesize: %d(%08x)\n",
                    (ulong)statbuf.__glibc_reserved[2]._4_4_,
                    (ulong)statbuf.__glibc_reserved[2]._4_4_,(int)statbuf.st_rdev,
                    (int)statbuf.st_rdev);
            fclose(__stream);
            return -1;
          }
          bVar1 = true;
          statbuf.__glibc_reserved[2]._4_4_ = uVar3;
        }
        if ((int)statbuf.__glibc_reserved[2]._4_4_ < 1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                  ,0xe7,"Header size field: %d\n",(ulong)statbuf.__glibc_reserved[2]._4_4_);
          fclose(__stream);
          file_local._4_4_ = -1;
        }
        else {
          iVar4 = (int)statbuf.__glibc_reserved[2]._4_4_ / cepsize;
          if (iVar4 * cepsize == statbuf.__glibc_reserved[2]._4_4_) {
            ppfVar6 = (float **)
                      __ckd_calloc_2d__((long)iVar4,(long)cepsize,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                                        ,0xf5);
            statbuf.__glibc_reserved[2]._4_4_ = iVar4 * cepsize;
            sVar5 = fread(*ppfVar6,4,(long)(int)statbuf.__glibc_reserved[2]._4_4_,__stream);
            if ((int)sVar5 == statbuf.__glibc_reserved[2]._4_4_) {
              if (bVar1) {
                for (byterev = 0; byterev < (int)statbuf.__glibc_reserved[2]._4_4_;
                    byterev = byterev + 1) {
                  (*ppfVar6)[byterev] =
                       (float)((int)(*ppfVar6)[byterev] >> 0x18 & 0xffU |
                               (int)(*ppfVar6)[byterev] >> 8 & 0xff00U |
                               ((uint)(*ppfVar6)[byterev] & 0xff00) << 8 |
                              (int)(*ppfVar6)[byterev] << 0x18);
                }
              }
              fclose(__stream);
              *numframes = iVar4;
              *cep = ppfVar6;
              file_local._4_4_ = 0;
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                      ,0xfa,"Error reading mfc data from the file \'%s\'",file);
              fclose(__stream);
              file_local._4_4_ = -1;
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                    ,0xf0,"Header size field: %d; not multiple of %d\n",
                    (ulong)statbuf.__glibc_reserved[2]._4_4_,(ulong)(uint)cepsize);
            fclose(__stream);
            file_local._4_4_ = -1;
          }
        }
      }
      else {
        fclose(__stream);
        file_local._4_4_ = -1;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int
read_cep(char const *file, float ***cep, int *numframes, int cepsize)
{
    FILE *fp;
    int n_float;
    struct stat statbuf;
    int i, n, byterev;
    float32 **mfcbuf;

    if (stat_retry(file, &statbuf) < 0) {
        E_ERROR_SYSTEM("Failed to get file size '%s'", file);
        return IO_ERR;
    }

    if ((fp = fopen(file, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open '%s' for reading", file);
        return IO_ERR;
    }

    /* Read #floats in header */
    if (fread(&n_float, sizeof(int), 1, fp) != 1) {
        fclose(fp);
        return IO_ERR;
    }

    /* Check if n_float matches file size */
    byterev = FALSE;
    if ((int) (n_float * sizeof(float) + 4) != statbuf.st_size) {
        n = n_float;
        SWAP_INT32(&n);

        if ((int) (n * sizeof(float) + 4) != statbuf.st_size) {
    	    E_ERROR("Header size field: %d(%08x); filesize: %d(%08x)\n",
                 n_float, n_float, (int) statbuf.st_size,
                 (int) statbuf.st_size);
            fclose(fp);
            return IO_ERR;
        }

        n_float = n;
        byterev = TRUE;
    }
    if (n_float <= 0) {
        E_ERROR("Header size field: %d\n", n_float);
        fclose(fp);
        return IO_ERR;
    }

    /* n = #frames of input */
    n = n_float / cepsize;
    if (n * cepsize != n_float) {
        E_ERROR("Header size field: %d; not multiple of %d\n",
               n_float, cepsize);
        fclose(fp);
        return IO_ERR;
    }

    mfcbuf = (float **) ckd_calloc_2d(n, cepsize, sizeof(float32));

    /* Read mfc data and byteswap if necessary */
    n_float = n * cepsize;
    if ((int) fread(mfcbuf[0], sizeof(float), n_float, fp) != n_float) {
        E_ERROR("Error reading mfc data from the file '%s'", file);
        fclose(fp);
        return IO_ERR;
    }
    if (byterev) {
        for (i = 0; i < n_float; i++)
            SWAP_FLOAT32(&(mfcbuf[0][i]));
    }
    fclose(fp);

    *numframes = n;
    *cep = mfcbuf;
    return IO_SUCCESS;
}